

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::tryRead
          (PromisedAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  void *pvVar3;
  PromiseArena *in_R8;
  undefined1 local_70 [32];
  Event *local_50;
  undefined1 local_48 [24];
  
  if (*(long *)((long)buffer + 0x30) == 0) {
    local_70._16_8_ = in_R8;
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_70);
    uVar2 = local_70._0_8_;
    pPVar1 = ((PromiseArenaMember *)local_70._0_8_)->arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_70._0_8_ - (long)pPVar1) < 0x40) {
      pvVar3 = operator_new(0x400);
      local_70._8_8_ = (long)pvVar3 + 0x3c0;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_70._8_8_,(OwnPromiseNode *)local_70,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2383:39)>
                 ::anon_class_32_4_a4bd11c1_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3c0) = &PTR_destroy_0070c670;
      *(void **)((long)pvVar3 + 0x3e0) = buffer;
      *(size_t *)((long)pvVar3 + 1000) = minBytes;
      *(size_t *)((long)pvVar3 + 0x3f0) = maxBytes;
      *(undefined8 *)((long)pvVar3 + 0x3f8) = local_70._16_8_;
      *(void **)((long)pvVar3 + 0x3c8) = pvVar3;
    }
    else {
      ((PromiseArenaMember *)local_70._0_8_)->arena = (PromiseArena *)0x0;
      local_70._8_8_ = local_70._0_8_ + -0x40;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_70._8_8_,(OwnPromiseNode *)local_70,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2383:39)>
                 ::anon_class_32_4_a4bd11c1_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0070c670;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)buffer;
      ((PromiseArenaMember *)(uVar2 + -0x20))->arena = (PromiseArena *)minBytes;
      ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)maxBytes;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = (PromiseArena *)local_70._16_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->arena = pPVar1;
    }
    local_70._24_8_ = local_70._8_8_;
    local_48._0_8_ = &DAT_005053bd;
    local_48._8_8_ = &DAT_0050541c;
    local_48._16_8_ = (char *)0x4c0000058b;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,(OwnPromiseNode *)(local_70 + 0x18),
               (SourceLocation *)local_48);
    uVar2 = local_70._24_8_;
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_50;
    if ((EventLoop *)local_70._24_8_ != (EventLoop *)0x0) {
      local_70._24_8_ = (EventLoop *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    uVar2 = local_70._0_8_;
    if ((PromiseArenaMember *)local_70._0_8_ != (PromiseArenaMember *)0x0) {
      local_70._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
  }
  else {
    (**(code **)(**(long **)((long)buffer + 0x30) + 8))
              (this,*(long **)((long)buffer + 0x30),minBytes,maxBytes);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->tryRead(buffer, minBytes, maxBytes);
    }